

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void finishbinexpval(FuncState *fs,expdesc *e1,expdesc *e2,OpCode op,int v2,int flip,int line,
                    OpCode mmop,TMS event)

{
  int iVar1;
  int iVar2;
  int r2;
  int r1;
  
  iVar1 = luaK_exp2anyreg(fs,e1);
  iVar2 = luaK_code(fs,v2 << 0x18 | op | iVar1 << 0x10);
  r2 = -1;
  r1 = -1;
  if (e1->k == VNONRELOC) {
    r1 = (e1->u).info;
  }
  if (e2->k == VNONRELOC) {
    r2 = (e2->u).info;
  }
  freeregs(fs,r1,r2);
  (e1->u).info = iVar2;
  e1->k = VRELOC;
  luaK_fixline(fs,line);
  luaK_code(fs,flip << 0xf | v2 << 0x10 | mmop | event << 0x18 | iVar1 << 7);
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void finishbinexpval (FuncState *fs, expdesc *e1, expdesc *e2,
                             OpCode op, int v2, int flip, int line,
                             OpCode mmop, TMS event) {
  int v1 = luaK_exp2anyreg(fs, e1);
  int pc = luaK_codeABCk(fs, op, 0, v1, v2, 0);
  freeexps(fs, e1, e2);
  e1->u.info = pc;
  e1->k = VRELOC;  /* all those operations are relocatable */
  luaK_fixline(fs, line);
  luaK_codeABCk(fs, mmop, v1, v2, cast_int(event), flip);  /* metamethod */
  luaK_fixline(fs, line);
}